

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.cpp
# Opt level: O0

bool __thiscall stream::chunk::operator<(chunk *this,chunk *o)

{
  chunk *o_local;
  chunk *this_local;
  bool local_1;
  
  if (this->first_slice == o->first_slice) {
    if (this->sort_offset == o->sort_offset) {
      if (this->size == o->size) {
        if (this->compression == o->compression) {
          if (this->encryption == o->encryption) {
            local_1 = false;
          }
          else {
            local_1 = (int)this->encryption < (int)o->encryption;
          }
        }
        else {
          local_1 = (int)this->compression < (int)o->compression;
        }
      }
      else {
        local_1 = this->size < o->size;
      }
    }
    else {
      local_1 = this->sort_offset < o->sort_offset;
    }
  }
  else {
    local_1 = this->first_slice < o->first_slice;
  }
  return local_1;
}

Assistant:

bool chunk::operator<(const chunk & o) const {
	
	if(first_slice != o.first_slice) {
		return (first_slice < o.first_slice);
	} else if(sort_offset != o.sort_offset) {
		return (sort_offset < o.sort_offset);
	} else if(size != o.size) {
		return (size < o.size);
	} else if(compression != o.compression) {
		return (compression < o.compression);
	} else if(encryption != o.encryption) {
		return (encryption < o.encryption);
	}
	
	return false;
}